

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_deserialize_safe(void *buf,size_t maxbytes)

{
  uint uVar1;
  ulong in_RSI;
  char *in_RDI;
  uint32_t elem;
  uint32_t i;
  roaring_bulk_context_t context;
  roaring_bitmap_t *bitmap;
  uint32_t *elems;
  uint32_t card;
  char *bufaschar;
  roaring_bulk_context_t *in_stack_ffffffffffffffa8;
  uint uVar2;
  undefined1 local_48 [8];
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  roaring_bitmap_t *local_8;
  
  if (in_RSI == 0) {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  else if (*in_RDI == '\x01') {
    if (in_RSI < 5) {
      local_8 = (roaring_bitmap_t *)0x0;
    }
    else {
      uVar1 = *(uint *)(in_RDI + 1);
      if (in_RSI < (ulong)uVar1 * 4 + 5) {
        local_8 = (roaring_bitmap_t *)0x0;
      }
      else {
        local_8 = roaring_bitmap_create();
        if (local_8 == (roaring_bitmap_t *)0x0) {
          local_8 = (roaring_bitmap_t *)0x0;
        }
        else {
          memset(local_48,0,0x10);
          for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
            roaring_bitmap_add_bulk
                      ((roaring_bitmap_t *)
                       CONCAT44(uVar2,*(undefined4 *)(in_RDI + (ulong)uVar2 * 4 + 5)),
                       in_stack_ffffffffffffffa8,0);
          }
        }
      }
    }
  }
  else if (*in_RDI == '\x02') {
    local_8 = roaring_bitmap_portable_deserialize_safe
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_deserialize_safe(const void *buf,
                                                  size_t maxbytes) {
    if (maxbytes < 1) {
        return NULL;
    }

    const char *bufaschar = (const char *)buf;
    if (bufaschar[0] == CROARING_SERIALIZATION_ARRAY_UINT32) {
        if (maxbytes < 1 + sizeof(uint32_t)) {
            return NULL;
        }

        /* This looks like a compressed set of uint32_t elements */
        uint32_t card;
        memcpy(&card, bufaschar + 1, sizeof(uint32_t));

        // Check the buffer is big enough to contain card uint32_t elements
        if (maxbytes < 1 + sizeof(uint32_t) + card * sizeof(uint32_t)) {
            return NULL;
        }

        const uint32_t *elems =
            (const uint32_t *)(bufaschar + 1 + sizeof(uint32_t));

        roaring_bitmap_t *bitmap = roaring_bitmap_create();
        if (bitmap == NULL) {
            return NULL;
        }
        roaring_bulk_context_t context = {0};
        for (uint32_t i = 0; i < card; i++) {
            // elems may not be aligned, read with memcpy
            uint32_t elem;
            memcpy(&elem, elems + i, sizeof(elem));
            roaring_bitmap_add_bulk(bitmap, &context, elem);
        }
        return bitmap;

    } else if (bufaschar[0] == CROARING_SERIALIZATION_CONTAINER) {
        return roaring_bitmap_portable_deserialize_safe(bufaschar + 1,
                                                        maxbytes - 1);
    } else
        return (NULL);
}